

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void forbody(LexState *ls,int base,int line,int nvars,int isnum)

{
  FuncState *fs_00;
  int local_4c;
  int local_48;
  int endfor;
  int prep;
  FuncState *fs;
  BlockCnt bl;
  int isnum_local;
  int nvars_local;
  int line_local;
  int base_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  bl._16_4_ = isnum;
  bl._20_4_ = nvars;
  adjustlocalvars(ls,3);
  checknext(ls,0x103);
  if (bl._16_4_ == 0) {
    local_4c = luaK_jump(fs_00);
  }
  else {
    local_4c = luaK_codeABx(fs_00,OP_FORPREP,base,0x1fffe);
  }
  enterblock(fs_00,(BlockCnt *)&fs,'\0');
  adjustlocalvars(ls,bl._20_4_);
  luaK_reserveregs(fs_00,bl._20_4_);
  block(ls);
  leaveblock(fs_00);
  luaK_patchtohere(fs_00,local_4c);
  if (bl._16_4_ == 0) {
    luaK_codeABC(fs_00,OP_TFORCALL,base,0,bl._20_4_);
    luaK_fixline(fs_00,line);
    local_48 = luaK_codeABx(fs_00,OP_TFORLOOP,base + 2,0x1fffe);
  }
  else {
    local_48 = luaK_codeABx(fs_00,OP_FORLOOP,base,0x1fffe);
  }
  luaK_patchlist(fs_00,local_48,local_4c + 1);
  luaK_fixline(fs_00,line);
  return;
}

Assistant:

static void forbody (LexState *ls, int base, int line, int nvars, int isnum) {
  /* forbody -> DO block */
  BlockCnt bl;
  FuncState *fs = ls->fs;
  int prep, endfor;
  adjustlocalvars(ls, 3);  /* control variables */
  checknext(ls, TK_DO);
  prep = isnum ? luaK_codeAsBx(fs, OP_FORPREP, base, NO_JUMP) : luaK_jump(fs);
  enterblock(fs, &bl, 0);  /* scope for declared variables */
  adjustlocalvars(ls, nvars);
  luaK_reserveregs(fs, nvars);
  block(ls);
  leaveblock(fs);  /* end of scope for declared variables */
  luaK_patchtohere(fs, prep);
  if (isnum)  /* numeric for? */
    endfor = luaK_codeAsBx(fs, OP_FORLOOP, base, NO_JUMP);
  else {  /* generic for */
    luaK_codeABC(fs, OP_TFORCALL, base, 0, nvars);
    luaK_fixline(fs, line);
    endfor = luaK_codeAsBx(fs, OP_TFORLOOP, base + 2, NO_JUMP);
  }
  luaK_patchlist(fs, endfor, prep + 1);
  luaK_fixline(fs, line);
}